

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

token * get_next_token(Source_File *src,automata_entry *start_state,char skip_new_line)

{
  KEYWORDS KVar1;
  char cVar2;
  token *ptVar3;
  KEYWORDS kw;
  automata_entry *paVar4;
  automata_entry *paVar5;
  
  skip_white_space(src,skip_new_line);
  src->token_size = 0;
  src->best_token_size = 0;
  src->best_token_line = src->which_row;
  src->best_token_column = src->which_column;
  src->best_token_where_in_src_end = src->where_in_src;
  src->best_token_where_in_src_start = src->where_in_src;
  cVar2 = src_getc(src,'\x01','\0','\0');
  paVar5 = start_state;
  if (cVar2 != '\0') {
    paVar4 = start_state;
    do {
      if (cVar2 == '\n' && skip_new_line == '\0') break;
      paVar4 = paVar4->delta[cmpr[cVar2]];
      if (paVar4 == (automata_entry *)0x0) {
        kw = paVar5->type;
        if ((kw != PKW_COMMENT) && (kw != KW_COMMENT)) goto LAB_00145f01;
        src->token_size = 0;
        src->best_token_size = 0;
        src->best_token_line = src->which_row;
        src->best_token_column = src->which_column;
        src->where_in_src = src->best_token_where_in_src_end;
        src->best_token_where_in_src_start = src->best_token_where_in_src_end;
        skip_white_space(src,'\x01');
        paVar4 = start_state;
        paVar5 = start_state;
      }
      else if (paVar4->is_final != '\0') {
        src->best_token_size = src->token_size;
        src->best_token_line = src->which_row;
        src->best_token_column = src->which_column;
        src->best_token_where_in_src_end = src->where_in_src;
        src->best_token_beg_line = src->is_in_the_begining_of_line;
        paVar5 = paVar4;
      }
      cVar2 = src_getc(src,'\x01','\0','\0');
    } while (cVar2 != '\0');
  }
  KVar1 = paVar5->type;
  kw = KW_NOTYPE;
  if ((KVar1 != KW_COMMENT) && (KVar1 != PKW_COMMENT)) {
    kw = KVar1;
  }
LAB_00145f01:
  ptVar3 = src_extract_token(src,kw);
  return ptVar3;
}

Assistant:

struct token* get_next_token(struct Source_File *src,struct automata_entry *start_state,char skip_new_line)
{
	int temp;
	char hold_char;

	struct token *ret;
	struct automata_entry *current_state;
	struct automata_entry *best_state;

	/*ignore leading spaces,tabs and newlines*/
	skip_white_space(src,skip_new_line);

	src_reset_token_data(src,1);

	best_state=current_state=start_state;


	while( (hold_char=src_getc(src,1,0,0)) !='\0')
	{
		if(hold_char=='\n' && !skip_new_line)
		{
			break;
		}
		current_state=current_state->delta[cmpr[hold_char]];
		if(current_state==NULL)
		{
			if(best_state->type==KW_COMMENT || best_state->type==PKW_COMMENT)
			{
				/*TODO account for new lines not counted in comment*/
				src_reset_token_data(src,0);
				best_state=current_state=start_state;
				skip_white_space(src,1);
			}else
			{
				return src_extract_token(src,best_state->type);
			}

		}else
		{
			if(current_state->is_final)
			{
				best_state=current_state;
				src_assimilate_into_best_token(src);
			}
		}
	}

	if(best_state->type==KW_COMMENT || best_state->type==PKW_COMMENT)
	{
		return src_extract_token(src,KW_NOTYPE);
	}else
	{
		return src_extract_token(src,best_state->type);
	}
	return ret;
}